

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O3

void mapHeatIce(Layer *l,int *out,longlong areaX,longlong areaZ,int areaWidth,int areaHeight)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  long local_40;
  
  (*l->p->getMap)(l->p,out,(long)((int)areaX + -1),(long)((int)areaZ + -1),areaWidth + 2,
                  areaHeight + 2);
  if (0 < areaHeight) {
    lVar1 = (long)areaWidth;
    piVar5 = out + lVar1 + 3;
    piVar6 = out + lVar1 * 2 + 5;
    local_40 = (lVar1 << 0x20) + 0x400000000;
    uVar7 = 0;
    piVar8 = out;
    piVar9 = out;
    do {
      if (0 < areaWidth) {
        lVar2 = 0;
        lVar4 = local_40;
        do {
          iVar3 = *(int *)((long)piVar5 + lVar2);
          if (iVar3 == 4) {
            iVar3 = 4 - (uint)(*(int *)((long)piVar6 + lVar2) - 1U < 2 ||
                              ((*(int *)((long)piVar5 + lVar2 + -4) - 1U < 2 ||
                               *(int *)((long)piVar8 + lVar2 + 4) - 1U < 2) ||
                              *(int *)((long)out + (lVar4 >> 0x1e)) - 1U < 2));
          }
          *(int *)((long)piVar9 + lVar2) = iVar3;
          lVar2 = lVar2 + 4;
          lVar4 = lVar4 + 0x100000000;
        } while ((ulong)(uint)areaWidth << 2 != lVar2);
      }
      uVar7 = uVar7 + 1;
      piVar9 = piVar9 + lVar1;
      piVar5 = piVar5 + lVar1 + 2;
      local_40 = local_40 + (lVar1 << 0x20) + 0x200000000;
      piVar6 = piVar6 + lVar1 + 2;
      piVar8 = piVar8 + lVar1 + 2;
    } while (uVar7 != (uint)areaHeight);
  }
  return;
}

Assistant:

void mapHeatIce(Layer *l, int *__restrict out, long long areaX, long long areaZ, int areaWidth, int areaHeight) {
    int pX = (int) areaX - 1;
    int pZ = (int) areaZ - 1;
    int pWidth = areaWidth + 2;
    int pHeight = areaHeight + 2;
    int x, z;

    l->p->getMap(l->p, out, pX, pZ, pWidth, pHeight);

    for (z = 0; z < areaHeight; z++) {
        for (x = 0; x < areaWidth; x++) {
            int v11 = out[x + 1 + (z + 1) * pWidth];

            if (v11 == 4) {
                int v10 = out[x + 1 + (z + 0) * pWidth];
                int v21 = out[x + 2 + (z + 1) * pWidth];
                int v01 = out[x + 0 + (z + 1) * pWidth];
                int v12 = out[x + 1 + (z + 2) * pWidth];

                if (v10 == 1 || v10 == 2 || v21 == 1 || v21 == 2 || v01 == 1 || v01 == 2 || v12 == 1 || v12 == 2) {
                    v11 = 3;
                }
            }

            out[x + z * areaWidth] = v11;
        }
    }
}